

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_bitmap.cpp
# Opt level: O2

void addTests_Bitmap(UnitTestFramework *framework)

{
  allocator local_29;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"Save and load white gray-scale image",&local_29)
  ;
  UnitTestFramework::add(framework,bitmap_operation::WhiteGrayScaleImage,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"Save and load black gray-scale image",&local_29)
  ;
  UnitTestFramework::add(framework,bitmap_operation::BlackGrayScaleImage,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"Save and load random RGB image",&local_29);
  UnitTestFramework::add(framework,bitmap_operation::RandomRGBImage,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void addTests_Bitmap( UnitTestFramework & framework )
{
    framework.add(bitmap_operation::WhiteGrayScaleImage, "Save and load white gray-scale image");
    framework.add(bitmap_operation::BlackGrayScaleImage, "Save and load black gray-scale image");
    framework.add(bitmap_operation::RandomRGBImage,      "Save and load random RGB image");
}